

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> * __thiscall
flatbuffers::Parser::GetIncludedFiles
          (vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
           *__return_storage_ptr__,Parser *this)

{
  const_iterator cVar1;
  allocator_type local_11;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
          ::find(&(this->files_included_per_file_)._M_t,&this->file_being_parsed_);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->
    super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>>::
    vector<std::_Rb_tree_const_iterator<flatbuffers::IncludedFile>,void>
              ((vector<flatbuffers::IncludedFile,std::allocator<flatbuffers::IncludedFile>> *)
               __return_storage_ptr__,cVar1._M_node[2]._M_right,
               (_Rb_tree_const_iterator<flatbuffers::IncludedFile>)&cVar1._M_node[2]._M_parent,
               &local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IncludedFile> Parser::GetIncludedFiles() const {
  const auto it = files_included_per_file_.find(file_being_parsed_);
  if (it == files_included_per_file_.end()) { return {}; }

  return { it->second.cbegin(), it->second.cend() };
}